

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthread.cpp
# Opt level: O3

void __thiscall
QtPrivate::BindingStatusOrList::setStatusAndClearList
          (BindingStatusOrList *this,QBindingStatus *status)

{
  ulong uVar1;
  long *plVar2;
  long *plVar3;
  long *plVar4;
  
  uVar1 = (this->data).super___atomic_base<unsigned_long_long>._M_i;
  plVar4 = (long *)(uVar1 & 0xfffffffffffffffe);
  if (plVar4 != (long *)0x0 && (uVar1 & 1) != 0) {
    plVar3 = (long *)*plVar4;
    plVar2 = (long *)plVar4[1];
    if (plVar3 != plVar2) {
      do {
        QObjectPrivate::reinitBindingStorageAfterThreadMove(*(QObjectPrivate **)(*plVar3 + 8));
        plVar3 = plVar3 + 1;
      } while (plVar3 != plVar2);
      plVar3 = (long *)*plVar4;
    }
    if (plVar3 != (long *)0x0) {
      operator_delete(plVar3,plVar4[2] - (long)plVar3);
    }
    operator_delete(plVar4,0x18);
  }
  (this->data).super___atomic_base<unsigned_long_long>._M_i = (__int_type)status;
  return;
}

Assistant:

void QtPrivate::BindingStatusOrList::setStatusAndClearList(QBindingStatus *status) noexcept
{

    if (auto pendingObjects = list()) {
        for (auto obj: *pendingObjects)
            QObjectPrivate::get(obj)->reinitBindingStorageAfterThreadMove();
        delete pendingObjects;
    }
    // synchronizes-with the load-acquire in bindingStatus():
    data.store(encodeBindingStatus(status), std::memory_order_release);
}